

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

bool vkt::Draw::anon_unknown_0::imageCompare
               (TestLog *log,ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
               VkPrimitiveTopology topology)

{
  bool bVar1;
  IVec3 local_3c;
  Vector<unsigned_int,_4> local_30;
  
  if (topology != VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    bVar1 = tcu::fuzzyCompare(log,"Result","Image comparison result",reference,result,0.05,
                              COMPARE_LOG_RESULT);
    return bVar1;
  }
  tcu::Vector<unsigned_int,_4>::Vector(&local_30,4);
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 0;
  bVar1 = tcu::intThresholdPositionDeviationCompare
                    (log,"Result","Image comparison result",reference,result,&local_30,&local_3c,
                     true,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

inline bool imageCompare (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& reference, const tcu::ConstPixelBufferAccess& result, const vk::VkPrimitiveTopology topology)
{
	if (topology == vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
	{
		return tcu::intThresholdPositionDeviationCompare(
			log, "Result", "Image comparison result", reference, result,
			tcu::UVec4(4u),					// color threshold
			tcu::IVec3(1, 1, 0),			// position deviation tolerance
			true,							// don't check the pixels at the boundary
			tcu::COMPARE_LOG_RESULT);
	}
	else
		return tcu::fuzzyCompare(log, "Result", "Image comparison result", reference, result, 0.05f, tcu::COMPARE_LOG_RESULT);
}